

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O1

from_chars_result_t<char>
fast_float::from_chars_advanced<double,char>
          (char *first,char *last,double *value,parse_options_t<char> options)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  from_chars_result_t<char> fVar17;
  from_chars_result_t<char> fVar18;
  from_chars_result_t<char> fVar19;
  from_chars_result_t<char> fVar20;
  from_chars_result_t<char> fVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  undefined4 uVar25;
  long lVar26;
  size_t sVar27;
  byte bVar28;
  undefined4 uVar29;
  byte *pbVar30;
  long lVar31;
  ulong uVar32;
  byte *pbVar33;
  byte *pbVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  size_t sVar39;
  ulong uVar40;
  ulong uVar41;
  byte *pbVar42;
  byte *pbVar43;
  int iVar44;
  byte *pbVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  from_chars_result_t<char> fVar49;
  adjusted_mantissa aVar50;
  parsed_number_string_t<char> answer;
  parsed_number_string_t<char> local_98;
  byte *local_50;
  parse_options_t<char> local_48;
  double *local_40;
  char *local_38;
  
  if (first == last) {
    fVar49._8_8_ = 0x16;
    fVar49.ptr = first;
    return fVar49;
  }
  local_98.fraction.ptr = (char *)0x0;
  local_98.fraction.length = 0;
  local_98.integer.ptr = (char *)0x0;
  local_98.integer.length = 0;
  local_98.exponent = 0;
  local_98.mantissa._0_3_ = 0;
  local_98.mantissa._3_5_ = 0;
  local_98.lastmatch._0_3_ = 0;
  local_98.lastmatch._3_5_ = 0;
  local_98.valid = false;
  local_98.too_many_digits = false;
  cVar1 = *first;
  local_98.negative = cVar1 == '-';
  bVar28 = options.decimal_point;
  pbVar30 = (byte *)first;
  if (!local_98.negative) goto LAB_0013246b;
  pbVar30 = (byte *)(first + 1);
  if (pbVar30 != (byte *)last) {
    bVar22 = *pbVar30 - 0x30;
    if (((ulong)options & 0x20) == 0) {
      if (*pbVar30 == bVar28 || bVar22 < 10) {
LAB_0013246b:
        bVar46 = pbVar30 == (byte *)last;
        if ((bVar46) || (bVar22 = *pbVar30, 9 < (byte)(bVar22 - 0x30))) {
          uVar36 = 0;
          pbVar34 = pbVar30;
        }
        else {
          uVar36 = 0;
          pbVar33 = pbVar30;
          do {
            pbVar33 = pbVar33 + 1;
            uVar36 = ((ulong)bVar22 + uVar36 * 10) - 0x30;
            bVar46 = pbVar33 == (byte *)last;
            pbVar34 = (byte *)last;
            if (bVar46) break;
            bVar22 = *pbVar33;
            pbVar34 = pbVar33;
          } while ((byte)(bVar22 - 0x30) < 10);
        }
        local_98.integer.length = (long)pbVar34 - (long)pbVar30;
        local_98.integer.ptr = (char *)pbVar30;
        if ((((ulong)options & 0x20) == 0) ||
           ((local_98.integer.length != 0 &&
            (((long)local_98.integer.length < 2 || (*pbVar30 != 0x30)))))) {
          if (bVar46) {
            bVar46 = false;
          }
          else {
            bVar46 = *pbVar34 == bVar28;
          }
          if (bVar46) {
            local_98.fraction.ptr = (char *)(pbVar34 + 1);
            lVar31 = (long)last - (long)local_98.fraction.ptr;
            pbVar45 = (byte *)local_98.fraction.ptr;
            while ((pbVar33 = pbVar45, 7 < lVar31 &&
                   (uVar32 = *(long *)pbVar45 + 0xcfcfcfcfcfcfcfd0,
                   ((*(long *)pbVar45 + 0x4646464646464646U | uVar32) & 0x8080808080808080) == 0)))
            {
              uVar32 = (uVar32 >> 8) + uVar32 * 10;
              uVar36 = ((uVar32 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                        (uVar32 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar36 * 100000000;
              pbVar45 = pbVar45 + 8;
              lVar31 = lVar31 + -8;
            }
            for (; (pbVar45 != (byte *)last && (pbVar33 = pbVar45, (byte)(*pbVar45 - 0x30) < 10));
                pbVar45 = pbVar45 + 1) {
              uVar36 = (ulong)(byte)(*pbVar45 - 0x30) + uVar36 * 10;
              pbVar33 = (byte *)last;
            }
            pbVar45 = (byte *)local_98.fraction.ptr + -(long)pbVar33;
            local_98.fraction.length = (long)pbVar33 - (long)local_98.fraction.ptr;
            sVar39 = local_98.integer.length - (long)pbVar45;
            local_50 = (byte *)local_98.fraction.ptr;
            local_48 = options;
            local_40 = value;
            local_38 = first;
          }
          else {
            pbVar45 = (byte *)0x0;
            bVar46 = false;
            sVar39 = local_98.integer.length;
            pbVar33 = pbVar34;
          }
          if (((ulong)options & 0x20) == 0) {
            if (sVar39 != 0) {
LAB_00132669:
              if ((((((ulong)options & 1) == 0) || (pbVar33 == (byte *)last)) ||
                  ((*pbVar33 | 0x20) != 0x65)) &&
                 (((((ulong)options & 0x40) == 0 || (pbVar33 == (byte *)last)) ||
                  ((0x39 < *pbVar33 - 0x2b ||
                   ((0x200000002000005U >> ((ulong)(*pbVar33 - 0x2b) & 0x3f) & 1) == 0)))))) {
                if ((options.format & general) == scientific) goto LAB_0013288e;
                lVar31 = 0;
              }
              else {
                pbVar42 = pbVar33;
                if ((*pbVar33 - 0x44 < 0x22) &&
                   ((0x300000003U >> ((ulong)(*pbVar33 - 0x44) & 0x3f) & 1) != 0)) {
                  pbVar42 = pbVar33 + 1;
                }
                if (pbVar42 == (byte *)last) {
LAB_00132710:
                  bVar46 = false;
                }
                else {
                  if (*pbVar42 != 0x2d) {
                    if (pbVar42 != (byte *)last) {
                      pbVar42 = pbVar42 + (*pbVar42 == 0x2b);
                    }
                    goto LAB_00132710;
                  }
                  pbVar42 = pbVar42 + 1;
                  bVar46 = true;
                }
                pbVar43 = pbVar42;
                if ((pbVar42 == (byte *)last) || (9 < (byte)(*pbVar42 - 0x30))) {
                  bVar22 = (byte)((ulong)options >> 2) & 1;
                  if (((ulong)options >> 2 & 1) != 0) {
                    pbVar43 = pbVar33;
                  }
                  lVar31 = 0;
                }
                else {
                  lVar26 = 0;
                  for (; (pbVar42 != (byte *)last &&
                         (pbVar43 = pbVar42, (byte)(*pbVar42 - 0x30) < 10)); pbVar42 = pbVar42 + 1)
                  {
                    if (lVar26 < 0x10000000) {
                      lVar26 = (ulong)(byte)(*pbVar42 - 0x30) + lVar26 * 10;
                    }
                    pbVar43 = (byte *)last;
                  }
                  lVar31 = -lVar26;
                  if (!bVar46) {
                    lVar31 = lVar26;
                  }
                  pbVar45 = pbVar45 + lVar31;
                  bVar22 = 1;
                }
                pbVar33 = pbVar43;
                if (bVar22 == 0) goto LAB_0013288e;
              }
              local_98.lastmatch._0_3_ = SUB83(pbVar33,0);
              local_98.lastmatch._3_5_ = (undefined5)((ulong)pbVar33 >> 0x18);
              local_98.valid = true;
              if (0x13 < (long)sVar39) {
                pbVar33 = pbVar30;
                if (pbVar30 != (byte *)last) {
                  do {
                    bVar22 = *pbVar33;
                    if (bVar22 != bVar28 && bVar22 != 0x30) break;
                    sVar39 = sVar39 - (bVar22 == 0x30);
                    pbVar33 = pbVar33 + 1;
                  } while (pbVar33 != (byte *)last);
                  if ((long)sVar39 < 0x14) goto LAB_00132884;
                }
                local_98.too_many_digits = true;
                pbVar33 = (byte *)local_98.fraction.ptr;
                sVar39 = local_98.fraction.length;
                if (local_98.integer.length == 0) {
                  uVar36 = 0;
                }
                else {
                  uVar36 = 0;
                  sVar27 = local_98.integer.length;
                  do {
                    sVar27 = sVar27 - 1;
                    uVar36 = ((long)(char)*pbVar30 + uVar36 * 10) - 0x30;
                    pbVar30 = pbVar30 + 1;
                    if (999999999999999999 < uVar36) break;
                  } while (sVar27 != 0);
                }
                for (; (uVar36 < 1000000000000000000 &&
                       (pbVar30 = pbVar33, pbVar34 = (byte *)local_98.fraction.ptr, sVar39 != 0));
                    sVar39 = sVar39 - 1) {
                  uVar36 = ((long)(char)*pbVar33 + uVar36 * 10) - 0x30;
                  pbVar30 = pbVar33 + 1;
                  pbVar33 = pbVar33 + 1;
                }
                pbVar45 = pbVar34 + (lVar31 - (long)pbVar30);
              }
LAB_00132884:
              local_98.mantissa._0_3_ = (undefined3)uVar36;
              local_98.mantissa._3_5_ = (undefined5)(uVar36 >> 0x18);
              local_98.exponent = (int64_t)pbVar45;
            }
          }
          else if (!(bool)(bVar46 & pbVar45 == (byte *)0x0)) goto LAB_00132669;
        }
      }
    }
    else if (bVar22 < 10) goto LAB_0013246b;
  }
LAB_0013288e:
  if (local_98.valid == false) {
    fVar21._8_8_ = 0x16;
    fVar21.ptr = first;
    if (((ulong)options & 0x10) != 0) {
      return fVar21;
    }
    fVar49 = detail::parse_infnan<double,char>(first,last,value);
    return fVar49;
  }
  uVar36 = CONCAT53(local_98.lastmatch._3_5_,local_98.lastmatch._0_3_);
  if (((byte *)0xffffffffffffffd2 < (byte *)(local_98.exponent + -0x17)) &&
     (local_98.too_many_digits == false)) {
    uVar25 = (undefined4)((uint5)local_98.mantissa._3_5_ >> 8);
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < local_98.exponent) &&
         (uVar32 = CONCAT53(local_98.mantissa._3_5_,(undefined3)local_98.mantissa),
         uVar32 <= binary_format_lookup_tables<double,_void>::max_mantissa[local_98.exponent])) {
        if (uVar32 == 0) {
          if (cVar1 == '-') {
            uVar24 = 0x80000000;
          }
          else {
            uVar24 = 0;
          }
          *value = (double)((ulong)uVar24 << 0x20);
          fVar20._8_8_ = 0;
          fVar20.ptr = (char *)uVar36;
          return fVar20;
        }
        auVar48._8_4_ = uVar25;
        auVar48._0_8_ = uVar32;
        auVar48._12_4_ = 0x45300000;
        dVar14 = ((auVar48._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar32) - 4503599627370496.0)) *
                 binary_format_lookup_tables<double,_void>::powers_of_ten[local_98.exponent];
        goto LAB_00132c63;
      }
    }
    else {
      uVar32 = CONCAT53(local_98.mantissa._3_5_,(undefined3)local_98.mantissa);
      if (uVar32 < 0x20000000000001) {
        auVar47._8_4_ = uVar25;
        auVar47._0_8_ = uVar32;
        auVar47._12_4_ = 0x45300000;
        dVar14 = (auVar47._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar32) - 4503599627370496.0);
        *value = dVar14;
        if (local_98.exponent < 0) {
          dVar14 = dVar14 / binary_format_lookup_tables<double,_void>::powers_of_ten
                            [-local_98.exponent];
        }
        else {
          dVar14 = dVar14 * binary_format_lookup_tables<double,_void>::powers_of_ten
                            [local_98.exponent];
        }
LAB_00132c63:
        fVar19._8_8_ = 0;
        fVar19.ptr = (char *)uVar36;
        fVar18._8_8_ = 0;
        fVar18.ptr = (char *)uVar36;
        *value = dVar14;
        if (cVar1 != '-') {
          return fVar18;
        }
        *value = -dVar14;
        return fVar19;
      }
    }
  }
  uVar32 = CONCAT53(local_98.mantissa._3_5_,(undefined3)local_98.mantissa);
  iVar44 = (int)local_98.exponent;
  if (local_98.exponent < -0x156 || uVar32 == 0) {
LAB_0013298b:
    uVar37 = 0;
LAB_0013299f:
    uVar38 = 0;
  }
  else {
    if (0x134 < local_98.exponent) {
      uVar37 = 0x7ff;
      goto LAB_0013299f;
    }
    uVar37 = 0x3f;
    if (uVar32 != 0) {
      for (; uVar32 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar38 = uVar32 << ((byte)(uVar37 ^ 0x3f) & 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar38;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = powers_template<void>::power_of_five_128[iVar44 * 2 + 0x2ac];
    auVar2 = auVar2 * auVar8;
    if ((~auVar2._8_4_ & 0x1ff) == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar38;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = powers_template<void>::power_of_five_128[iVar44 * 2 + 0x2ad];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = SUB168(auVar3 * auVar9,8);
      auVar2 = auVar2 + auVar15;
    }
    iVar23 = (((iVar44 * 0x3526a >> 0x10) - (int)(uVar37 ^ 0x3f)) - (auVar2._12_4_ >> 0x1f)) + 0x43e
    ;
    bVar28 = 9 - (auVar2[0xf] >> 7);
    uVar37 = auVar2._8_8_ >> (bVar28 & 0x3f);
    if (iVar23 < 1) {
      if (iVar23 < -0x3e) goto LAB_0013298b;
      bVar28 = 1 - (char)iVar23;
      uVar38 = (uVar37 >> (bVar28 & 0x3f)) + (ulong)((uVar37 >> ((ulong)bVar28 & 0x3f) & 1) != 0);
      uVar37 = (ulong)(uVar38 >> 0x35 != 0);
      uVar38 = uVar38 >> 1;
    }
    else {
      uVar38 = uVar37 & 0xfffffffffffffe;
      if (uVar37 << (bVar28 & 0x3f) != auVar2._8_8_ || ((uint)uVar37 & 3) != 1) {
        uVar38 = uVar37;
      }
      if (1 < auVar2._0_8_) {
        uVar38 = uVar37;
      }
      if ((byte *)0x1b < (byte *)(local_98.exponent + 4)) {
        uVar38 = uVar37;
      }
      uVar37 = (ulong)((uint)uVar38 & 1);
      bVar46 = uVar37 + uVar38 >> 0x36 != 0;
      uVar38 = (uVar38 >> 1) + (uVar37 & uVar38) & 0x7fefffffffffffff;
      if (bVar46) {
        uVar38 = 0;
      }
      uVar35 = iVar23 + (uint)bVar46;
      uVar24 = uVar35;
      if (0x7fe < (int)uVar35) {
        uVar24 = 0x7ff;
      }
      uVar37 = (ulong)uVar24;
      if (0x7fe < (int)uVar35) {
        uVar38 = 0;
      }
    }
  }
  if ((local_98.too_many_digits != true) || ((int)(uint)uVar37 < 0)) goto LAB_00132d64;
  uVar41 = uVar32 + 1;
  if (local_98.exponent < -0x156 || uVar41 == 0) {
    uVar24 = 0;
LAB_00132af6:
    uVar41 = 0;
  }
  else {
    if (0x134 < local_98.exponent) {
      uVar24 = 0x7ff;
      goto LAB_00132af6;
    }
    uVar40 = 0x3f;
    if (uVar41 != 0) {
      for (; uVar41 >> uVar40 == 0; uVar40 = uVar40 - 1) {
      }
    }
    uVar41 = uVar41 << ((byte)(uVar40 ^ 0x3f) & 0x3f);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar41;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = powers_template<void>::power_of_five_128[iVar44 * 2 + 0x2ac];
    auVar4 = auVar4 * auVar10;
    if ((~auVar4._8_4_ & 0x1ff) == 0) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar41;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = powers_template<void>::power_of_five_128[iVar44 * 2 + 0x2ad];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = SUB168(auVar5 * auVar11,8);
      auVar4 = auVar4 + auVar16;
    }
    iVar23 = (((iVar44 * 0x3526a >> 0x10) - (int)(uVar40 ^ 0x3f)) - (auVar4._12_4_ >> 0x1f)) + 0x43e
    ;
    bVar28 = 9 - (auVar4[0xf] >> 7);
    uVar41 = auVar4._8_8_ >> (bVar28 & 0x3f);
    if (iVar23 < 1) {
      if (iVar23 < -0x3e) {
        uVar24 = 0;
        uVar41 = 0;
      }
      else {
        bVar28 = 1 - (char)iVar23;
        uVar41 = (uVar41 >> (bVar28 & 0x3f)) + (ulong)((uVar41 >> ((ulong)bVar28 & 0x3f) & 1) != 0);
        uVar24 = (uint)(uVar41 >> 0x35 != 0);
        uVar41 = uVar41 >> 1;
      }
    }
    else {
      uVar40 = uVar41 & 0xfffffffffffffe;
      if (uVar41 << (bVar28 & 0x3f) != auVar4._8_8_ || ((uint)uVar41 & 3) != 1) {
        uVar40 = uVar41;
      }
      if (1 < auVar4._0_8_) {
        uVar40 = uVar41;
      }
      if ((byte *)0x1b < (byte *)(local_98.exponent + 4)) {
        uVar40 = uVar41;
      }
      uVar41 = (ulong)((uint)uVar40 & 1);
      bVar46 = uVar41 + uVar40 >> 0x36 != 0;
      uVar41 = (uVar40 >> 1) + (uVar41 & uVar40) & 0x7fefffffffffffff;
      if (bVar46) {
        uVar41 = 0;
      }
      uVar24 = iVar23 + (uint)bVar46;
      if (0x7fe < (int)uVar24) {
        uVar24 = 0x7ff;
        uVar41 = 0;
      }
    }
  }
  if ((uVar38 != uVar41) || ((uint)uVar37 != uVar24)) {
    uVar37 = 0x3f;
    if (uVar32 != 0) {
      for (; uVar32 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar32 = uVar32 << ((byte)(uVar37 ^ 0x3f) & 0x3f);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar32;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = powers_template<void>::power_of_five_128[iVar44 * 2 + 0x2ac];
    auVar6 = auVar6 * auVar12;
    lVar31 = auVar6._8_8_;
    if ((~auVar6._8_4_ & 0x1ff) == 0) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar32;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = powers_template<void>::power_of_five_128[iVar44 * 2 + 0x2ad];
      lVar31 = lVar31 + (ulong)CARRY8(SUB168(auVar7 * auVar13,8),auVar6._0_8_);
    }
    uVar37 = (ulong)((((iVar44 * 0x3526a >> 0x10) - (int)(uVar37 ^ 0x3f)) - (int)(lVar31 >> 0x3f)) -
                    0x7bcd);
    uVar38 = lVar31 << ((byte)((ulong)lVar31 >> 0x3f) ^ 1);
  }
LAB_00132d64:
  if ((int)uVar37 < 0) {
    aVar50._8_8_ = uVar37;
    aVar50.mantissa = uVar38;
    aVar50 = digit_comp<double,char>(&local_98,aVar50);
    uVar38 = aVar50.mantissa;
    uVar37 = (ulong)(uint)aVar50.power2;
  }
  uVar25 = 0;
  if ((int)uVar37 == 0x7ff) {
    uVar25 = 0x22;
  }
  uVar29 = 0x22;
  if ((int)uVar37 != 0) {
    uVar29 = uVar25;
  }
  *value = (double)(uVar37 << 0x34 | uVar38 | (ulong)local_98.negative << 0x3f);
  if (uVar38 != 0) {
    uVar29 = uVar25;
  }
  if (CONCAT53(local_98.mantissa._3_5_,(undefined3)local_98.mantissa) == 0) {
    uVar29 = uVar25;
  }
  fVar17.ec = uVar29;
  fVar17.ptr = (char *)uVar36;
  fVar17._12_4_ = 0;
  return fVar17;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (is_supported_float_type<T>(), "only some floating-point types are supported");
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    if (options.format & chars_format::no_infnan) {
      answer.ec = std::errc::invalid_argument;
      answer.ptr = first;
      return answer;
    } else {
      return detail::parse_infnan(first, last, value);
    }
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__) || defined(FASTFLOAT_32BIT)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? T(-0.) : T(0.);
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}